

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void __thiscall
wasm::GlobalTypeRewriter::mapTypeNamesAndIndices(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  mapped_type *pmVar1;
  mapped_type mVar2;
  Names *this_00;
  size_t sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  _Hash_node_base *p_Var11;
  string *in_R9;
  Name root;
  undefined1 local_d8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  typeNames;
  undefined8 *local_90;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 auStack_50 [8];
  Name deduped;
  
  local_d8 = (undefined1  [8])&typeNames._M_h._M_rehash_policy._M_next_resize;
  typeNames._M_h._M_buckets = (__buckets_ptr)0x1;
  typeNames._M_h._M_bucket_count = 0;
  typeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typeNames._M_h._M_element_count._0_4_ = 0x3f800000;
  typeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  typeNames._M_h._M_rehash_policy._4_4_ = 0;
  typeNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var11 = (this->wasm->typeNames)._M_h._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    do {
      auStack_50 = (undefined1  [8])local_d8;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_d8,p_Var11 + 2,auStack_50);
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  for (p_Var11 = (oldToNewTypes->_M_h)._M_before_begin._M_nxt; p_Var11 != (_Hash_node_base *)0x0;
      p_Var11 = p_Var11->_M_nxt) {
    if (p_Var11[1]._M_nxt != p_Var11[2]._M_nxt) {
      iVar7 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->wasm->typeNames)._M_h,(key_type *)(p_Var11 + 1));
      deduped.super_IString.str._M_str = (char *)(p_Var11 + 2);
      if (iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur != (__node_type *)0x0) {
        pmVar8 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->wasm->typeNames,(key_type *)deduped.super_IString.str._M_str
                             );
        pmVar1 = (mapped_type *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x10);
        uVar4 = *(undefined4 *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x14);
        uVar5 = *(undefined4 *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x18);
        uVar6 = *(undefined4 *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x1c);
        *(int *)&(pmVar8->name).super_IString.str._M_len =
             (int)(pmVar1->name).super_IString.str._M_len;
        *(undefined4 *)((long)&(pmVar8->name).super_IString.str._M_len + 4) = uVar4;
        *(undefined4 *)&(pmVar8->name).super_IString.str._M_str = uVar5;
        *(undefined4 *)((long)&(pmVar8->name).super_IString.str._M_str + 4) = uVar6;
        if (pmVar1 != pmVar8) {
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&pmVar8->fieldNames,
                     (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)((long)iVar7.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                               ._M_cur + 0x20));
        }
        this_00 = *(Names **)
                   ((long)iVar7.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                          ._M_cur + 0x10);
        sVar3 = *(size_t *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x18);
        local_88 = 0;
        local_90 = (undefined8 *)local_d8;
        local_78 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:330:24)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:330:24)>
                   ::_M_manager;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"_","");
        root.super_IString.str._M_str = (char *)&local_90;
        root.super_IString.str._M_len = sVar3;
        _auStack_50 = (string_view)
                      Names::getValidName(this_00,root,(function<bool_(wasm::Name)> *)0x0,
                                          (Index)(string *)local_70,in_R9);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,3);
        }
        *(undefined4 *)&(pmVar1->name).super_IString.str._M_len = auStack_50._0_4_;
        *(undefined4 *)
         ((long)iVar7.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur + 0x14) = auStack_50._4_4_;
        *(undefined4 *)
         ((long)iVar7.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur + 0x18) = (undefined4)deduped.super_IString.str._M_len;
        *(undefined4 *)
         ((long)iVar7.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur + 0x1c) = deduped.super_IString.str._M_len._4_4_;
        typeNames._M_h._M_single_bucket = (__node_base_ptr)local_d8;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)typeNames._M_h._M_single_bucket,auStack_50,&typeNames._M_h._M_single_bucket);
      }
      iVar9 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->wasm->typeIndices)._M_h,(key_type *)(p_Var11 + 1));
      if (iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
          _M_cur != (__node_type *)0x0) {
        mVar2 = *(mapped_type *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                        ._M_cur + 0x10);
        pmVar10 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->wasm->typeIndices,
                               (key_type *)deduped.super_IString.str._M_str);
        *pmVar10 = mVar2;
      }
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d8);
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypeNamesAndIndices(const TypeMap& oldToNewTypes) {
  // Update type names to avoid duplicates.
  std::unordered_set<Name> typeNames;
  for (auto& [type, info] : wasm.typeNames) {
    typeNames.insert(info.name);
  }
  for (auto& [old, new_] : oldToNewTypes) {
    if (old == new_) {
      // The type is being mapped to itself; no need to rename anything.
      continue;
    }

    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      auto& oldNames = it->second;
      wasm.typeNames[new_] = oldNames;
      // Use the existing name in the new type, as usually it completely
      // replaces the old. Rename the old name in a unique way to avoid
      // confusion in the case that it remains used.
      auto deduped = Names::getValidName(
        oldNames.name, [&](Name test) { return !typeNames.count(test); });
      oldNames.name = deduped;
      typeNames.insert(deduped);
    }
    if (auto it = wasm.typeIndices.find(old); it != wasm.typeIndices.end()) {
      // It's ok if we end up with duplicate indices. Ties will be resolved in
      // some arbitrary manner.
      wasm.typeIndices[new_] = it->second;
    }
  }
}